

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O0

void __thiscall spdlog::async_logger::sink_it_(async_logger *this,log_msg *msg)

{
  bool bVar1;
  exception *ex;
  shared_ptr<spdlog::details::thread_pool> pool_ptr;
  int unused;
  string_view sv;
  enable_shared_from_this<spdlog::async_logger> *in_stack_fffffffffffffd28;
  weak_ptr<spdlog::details::thread_pool> *in_stack_fffffffffffffd38;
  allocator *msg_00;
  allocator local_1d9;
  string local_1d8 [64];
  __shared_ptr local_198 [116];
  async_overflow_policy in_stack_fffffffffffffedc;
  log_msg *in_stack_fffffffffffffee0;
  async_logger_ptr *in_stack_fffffffffffffee8;
  thread_pool *in_stack_fffffffffffffef0;
  
  std::weak_ptr<spdlog::details::thread_pool>::lock(in_stack_fffffffffffffd38);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_198);
  if (!bVar1) {
    msg_00 = &local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"async log: thread pool doesn\'t exist anymore",msg_00);
    throw_spdlog_ex((string *)msg_00);
  }
  std::__shared_ptr_access<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x297a5b);
  std::enable_shared_from_this<spdlog::async_logger>::shared_from_this(in_stack_fffffffffffffd28);
  details::thread_pool::post_log
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffedc);
  std::shared_ptr<spdlog::async_logger>::~shared_ptr((shared_ptr<spdlog::async_logger> *)0x297aaf);
  std::shared_ptr<spdlog::details::thread_pool>::~shared_ptr
            ((shared_ptr<spdlog::details::thread_pool> *)0x297b82);
  return;
}

Assistant:

SPDLOG_INLINE void spdlog::async_logger::sink_it_(const details::log_msg &msg){
    SPDLOG_TRY{if (auto pool_ptr = thread_pool_.lock()){
        pool_ptr->post_log(shared_from_this(), msg, overflow_policy_);
}
else {
    throw_spdlog_ex("async log: thread pool doesn't exist anymore");
}
}
SPDLOG_LOGGER_CATCH(msg.source)
}